

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_a.cpp
# Opt level: O1

void msd_A_adaptive(uchar **strings,size_t N)

{
  cacheblock_t *cache;
  uchar **ppuVar1;
  size_t sVar2;
  
  cache = (cacheblock_t *)malloc(N << 4);
  if (N != 0) {
    ppuVar1 = &cache->ptr;
    sVar2 = 0;
    do {
      *ppuVar1 = strings[sVar2];
      sVar2 = sVar2 + 1;
      ppuVar1 = ppuVar1 + 2;
    } while (N != sVar2);
  }
  fill_cache(cache,N,0);
  msd_A_adaptive(cache,N,0,0);
  if (N != 0) {
    ppuVar1 = &cache->ptr;
    sVar2 = 0;
    do {
      strings[sVar2] = *ppuVar1;
      sVar2 = sVar2 + 1;
      ppuVar1 = ppuVar1 + 2;
    } while (N != sVar2);
  }
  free(cache);
  return;
}

Assistant:

void
msd_A_adaptive(unsigned char** strings, size_t N)
{
	cacheblock_t* cache = (cacheblock_t*) malloc(N*sizeof(cacheblock_t));
	for (size_t i=0; i < N; ++i) cache[i].ptr = strings[i];
	fill_cache(cache, N, 0);
	msd_A_adaptive(cache, N, 0, 0);
	for (size_t i=0; i < N; ++i) strings[i] = cache[i].ptr;
	free(cache);
}